

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void f_luaopen(lua_State *L,void *ud)

{
  global_State *g_00;
  global_State *g;
  void *ud_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  stack_init(L,L);
  init_registry(L,g_00);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  g_00->gcstp = '\0';
  (g_00->nilvalue).tt_ = '\0';
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  init_registry(L, g);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  g->gcstp = 0;  /* allow gc */
  setnilvalue(&g->nilvalue);  /* now state is complete */
  luai_userstateopen(L);
}